

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

bool __thiscall Highs::qFormatOk(Highs *this,HighsInt num_nz,HighsInt format)

{
  bool bVar1;
  
  if (num_nz == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = format == 1;
    if (!bVar1) {
      bVar1 = false;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Non-empty Hessian matrix has illegal format = %d\n",format);
    }
  }
  return bVar1;
}

Assistant:

bool Highs::qFormatOk(const HighsInt num_nz, const HighsInt format) {
  if (!num_nz) return true;
  const bool ok_format = format == (HighsInt)HessianFormat::kTriangular;
  assert(ok_format);
  if (!ok_format)
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "Non-empty Hessian matrix has illegal format = %" HIGHSINT_FORMAT "\n",
        format);
  return ok_format;
}